

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool duckdb::TryCast::Operation<float,unsigned_int>(float input,uint32_t *result,bool strict)

{
  bool bVar1;
  float fVar2;
  
  bVar1 = Value::IsFinite<float>(input);
  if (bVar1) {
    bVar1 = false;
    if ((0.0 <= input) && (bVar1 = false, input < 4.2949673e+09)) {
      fVar2 = nearbyintf(input);
      *result = (uint32_t)(long)fVar2;
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool TryCast::Operation(float input, uint32_t &result, bool strict) {
	return NumericTryCast::Operation<float, uint32_t>(input, result, strict);
}